

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Receptacle.cpp
# Opt level: O1

bool __thiscall Refal2::CReceptacle::Replace(CReceptacle *this,CUnitList *keyValue)

{
  CUnitNode *nodeAfter;
  bool bVar1;
  bool bVar2;
  CUnitNode *leftBorderNode;
  CUnitNode *equalNode;
  CUnitNode *local_30;
  CUnitNode *local_28;
  
  bVar1 = IsValidKeyValue(keyValue);
  if (bVar1) {
    local_30 = (CNodeType *)0x0;
    local_28 = (CUnitNode *)0x0;
    bVar2 = find(this,(keyValue->super_CNodeList<Refal2::CUnit>).first,&local_30,&local_28);
    nodeAfter = local_30;
    if (bVar2) {
      CNodeList<Refal2::CUnit>::Remove
                ((CNodeList<Refal2::CUnit> *)this,local_30->next,
                 ((local_30->super_CUnit).field_1.pairedParen)->prev);
      CNodeList<Refal2::CUnit>::InsertAfter
                ((CNodeList<Refal2::CUnit> *)this,nodeAfter,
                 &keyValue->super_CNodeList<Refal2::CUnit>);
    }
    else {
      burry(this,keyValue);
    }
    if ((keyValue->super_CNodeList<Refal2::CUnit>).first != (CNodeType *)0x0) {
      __assert_fail("keyValue.IsEmpty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Receptacle.cpp"
                    ,0x22,"bool Refal2::CReceptacle::Replace(CUnitList &)");
    }
  }
  return bVar1;
}

Assistant:

bool CReceptacle::Replace( CUnitList& keyValue )
{
	if( !IsValidKeyValue( keyValue ) ) {
		return false;
	}
	CUnitNode* leftBorderNode = nullptr;
	CUnitNode* equalNode = nullptr;
	if( find( keyValue.GetFirst(), leftBorderNode, equalNode ) ) {
		data.Remove( leftBorderNode->Next(),
			leftBorderNode->PairedParen()->Prev() );
		data.InsertAfter( leftBorderNode, keyValue );
	} else {
		burry( keyValue );
	}
	assert( keyValue.IsEmpty() );
	return true;
}